

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O3

int dwarf_get_CHILDREN_name(uint val,char **s_out)

{
  char *pcVar1;
  
  if (val == 0) {
    pcVar1 = "DW_CHILDREN_no";
  }
  else {
    if (val != 1) {
      return -1;
    }
    pcVar1 = "DW_CHILDREN_yes";
  }
  *s_out = pcVar1;
  return 0;
}

Assistant:

int
dwarf_get_CHILDREN_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_CHILDREN_no:
        *s_out = "DW_CHILDREN_no";
        return DW_DLV_OK;
    case DW_CHILDREN_yes:
        *s_out = "DW_CHILDREN_yes";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}